

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_cleanup(OSQPWorkspace *work)

{
  LinSysSolver *pLVar1;
  OSQPData *pOVar2;
  c_int cVar3;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar3 = 0;
  }
  else {
    pOVar2 = work->data;
    if (pOVar2 != (OSQPData *)0x0) {
      if (pOVar2->P != (csc *)0x0) {
        csc_spfree(pOVar2->P);
        pOVar2 = work->data;
      }
      if (pOVar2->A != (csc *)0x0) {
        csc_spfree(pOVar2->A);
        pOVar2 = work->data;
      }
      free(pOVar2->q);
      free(work->data->l);
      free(work->data->u);
      free(work->data);
    }
    if (work->scaling != (OSQPScaling *)0x0) {
      free(work->scaling->D);
      free(work->scaling->Dinv);
      free(work->scaling->E);
      free(work->scaling->Einv);
      free(work->scaling);
    }
    free(work->D_temp);
    free(work->D_temp_A);
    free(work->E_temp);
    pLVar1 = work->linsys_solver;
    if ((pLVar1 != (LinSysSolver *)0x0) && (pLVar1->free != (_func_void_LinSysSolver_ptr *)0x0)) {
      (*pLVar1->free)(pLVar1);
    }
    if (work->settings == (OSQPSettings *)0x0) {
      cVar3 = 0;
    }
    else {
      cVar3 = unload_linsys_solver(work->settings->linsys_solver);
    }
    if (work->pol != (OSQPPolish *)0x0) {
      free(work->pol->Alow_to_A);
      free(work->pol->Aupp_to_A);
      free(work->pol->A_to_Alow);
      free(work->pol->A_to_Aupp);
      free(work->pol->x);
      free(work->pol->z);
      free(work->pol->y);
      free(work->pol);
    }
    free(work->rho_vec);
    free(work->rho_inv_vec);
    free(work->constr_type);
    free(work->x);
    free(work->z);
    free(work->xz_tilde);
    free(work->x_prev);
    free(work->z_prev);
    free(work->y);
    free(work->Ax);
    free(work->Px);
    free(work->Aty);
    free(work->delta_y);
    free(work->Atdelta_y);
    free(work->delta_x);
    free(work->Pdelta_x);
    free(work->Adelta_x);
    free(work->settings);
    if (work->solution != (OSQPSolution *)0x0) {
      free(work->solution->x);
      free(work->solution->y);
      free(work->solution);
    }
    free(work->info);
    free(work->timer);
    free(work);
  }
  return cVar3;
}

Assistant:

c_int osqp_cleanup(OSQPWorkspace *work) {
  c_int exitflag = 0;

  if (work) { // If workspace has been allocated
    // Free Data
    if (work->data) {
      if (work->data->P) csc_spfree(work->data->P);
      if (work->data->A) csc_spfree(work->data->A);
      if (work->data->q) c_free(work->data->q);
      if (work->data->l) c_free(work->data->l);
      if (work->data->u) c_free(work->data->u);
      c_free(work->data);
    }

    // Free scaling variables
    if (work->scaling){
      if (work->scaling->D)    c_free(work->scaling->D);
      if (work->scaling->Dinv) c_free(work->scaling->Dinv);
      if (work->scaling->E)    c_free(work->scaling->E);
      if (work->scaling->Einv) c_free(work->scaling->Einv);
      c_free(work->scaling);
    }

    // Free temp workspace variables for scaling
    if (work->D_temp)   c_free(work->D_temp);
    if (work->D_temp_A) c_free(work->D_temp_A);
    if (work->E_temp)   c_free(work->E_temp);

    // Free linear system solver structure
    if (work->linsys_solver) {
      if (work->linsys_solver->free) {
        work->linsys_solver->free(work->linsys_solver);
      }
    }

    // Unload linear system solver after free
    if (work->settings) {
      exitflag = unload_linsys_solver(work->settings->linsys_solver);
    }

#ifndef EMBEDDED
    // Free active constraints structure
    if (work->pol) {
      if (work->pol->Alow_to_A) c_free(work->pol->Alow_to_A);
      if (work->pol->Aupp_to_A) c_free(work->pol->Aupp_to_A);
      if (work->pol->A_to_Alow) c_free(work->pol->A_to_Alow);
      if (work->pol->A_to_Aupp) c_free(work->pol->A_to_Aupp);
      if (work->pol->x)         c_free(work->pol->x);
      if (work->pol->z)         c_free(work->pol->z);
      if (work->pol->y)         c_free(work->pol->y);
      c_free(work->pol);
    }
#endif /* ifndef EMBEDDED */

    // Free other Variables
    if (work->rho_vec)     c_free(work->rho_vec);
    if (work->rho_inv_vec) c_free(work->rho_inv_vec);
#if EMBEDDED != 1
    if (work->constr_type) c_free(work->constr_type);
#endif
    if (work->x)           c_free(work->x);
    if (work->z)           c_free(work->z);
    if (work->xz_tilde)    c_free(work->xz_tilde);
    if (work->x_prev)      c_free(work->x_prev);
    if (work->z_prev)      c_free(work->z_prev);
    if (work->y)           c_free(work->y);
    if (work->Ax)          c_free(work->Ax);
    if (work->Px)          c_free(work->Px);
    if (work->Aty)         c_free(work->Aty);
    if (work->delta_y)     c_free(work->delta_y);
    if (work->Atdelta_y)   c_free(work->Atdelta_y);
    if (work->delta_x)     c_free(work->delta_x);
    if (work->Pdelta_x)    c_free(work->Pdelta_x);
    if (work->Adelta_x)    c_free(work->Adelta_x);

    // Free Settings
    if (work->settings) c_free(work->settings);

    // Free solution
    if (work->solution) {
      if (work->solution->x) c_free(work->solution->x);
      if (work->solution->y) c_free(work->solution->y);
      c_free(work->solution);
    }

    // Free information
    if (work->info) c_free(work->info);

# ifdef PROFILING
    // Free timer
    if (work->timer) c_free(work->timer);
# endif /* ifdef PROFILING */

    // Free work
    c_free(work);
  }

  return exitflag;
}